

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void BuildAddress(sockaddr_in *address,char *name)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  in_addr_t iVar4;
  uint uVar5;
  char *pcVar6;
  hostent *phVar7;
  int *piVar8;
  char *pcVar9;
  FString local_50;
  FString local_48;
  FString target;
  int local_38;
  char c;
  int curchar;
  bool isnamed;
  char *portpart;
  u_short port;
  hostent *hostentry;
  char *name_local;
  sockaddr_in *address_local;
  
  bVar1 = false;
  FString::FString(&local_48);
  address->sin_family = 2;
  pcVar6 = strchr(name,0x3a);
  if (pcVar6 == (char *)0x0) {
    FString::operator=(&local_48,name);
    portpart._6_2_ = DOOMPORT;
  }
  else {
    FString::FString(&local_50,name,(long)pcVar6 - (long)name);
    FString::operator=(&local_48,&local_50);
    FString::~FString(&local_50);
    iVar3 = atoi(pcVar6 + 1);
    portpart._6_2_ = (uint16_t)iVar3;
    if (portpart._6_2_ == 0) {
      Printf("Weird port: %s (using %d)\n",pcVar6 + 1,(ulong)DOOMPORT);
      portpart._6_2_ = DOOMPORT;
    }
  }
  uVar2 = htons(portpart._6_2_);
  address->sin_port = uVar2;
  local_38 = 0;
  do {
    pcVar6 = FString::operator[](&local_48,local_38);
    target.Chars._7_1_ = *pcVar6;
    if (target.Chars._7_1_ == '\0') {
LAB_005e2db5:
      if (bVar1) {
        pcVar6 = FString::operator_cast_to_char_(&local_48);
        phVar7 = gethostbyname(pcVar6);
        if (phVar7 == (hostent *)0x0) {
          pcVar6 = FString::GetChars(&local_48);
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          I_FatalError("gethostbyname: couldn\'t find %s\n%s",pcVar6,pcVar9);
        }
        (address->sin_addr).s_addr = *(in_addr_t *)*phVar7->h_addr_list;
        Printf("Node number %d, hostname %s\n",(ulong)(uint)(int)doomcom.numnodes,phVar7->h_name);
      }
      else {
        pcVar6 = FString::operator_cast_to_char_(&local_48);
        iVar4 = inet_addr(pcVar6);
        (address->sin_addr).s_addr = iVar4;
        uVar5 = (uint)doomcom.numnodes;
        pcVar6 = FString::GetChars(&local_48);
        Printf("Node number %d, address %s\n",(ulong)uVar5,pcVar6);
      }
      FString::~FString(&local_48);
      return;
    }
    if (((target.Chars._7_1_ < '0') || ('9' < target.Chars._7_1_)) && (target.Chars._7_1_ != '.')) {
      bVar1 = true;
      goto LAB_005e2db5;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void BuildAddress (sockaddr_in *address, const char *name)
{
	hostent *hostentry;		// host information entry
	u_short port;
	const char *portpart;
	bool isnamed = false;
	int curchar;
	char c;
	FString target;

	address->sin_family = AF_INET;

	if ( (portpart = strchr (name, ':')) )
	{
		target = FString(name, portpart - name);
		port = atoi (portpart + 1);
		if (!port)
		{
			Printf ("Weird port: %s (using %d)\n", portpart + 1, DOOMPORT);
			port = DOOMPORT;
		}
	}
	else
	{
		target = name;
		port = DOOMPORT;
	}
	address->sin_port = htons(port);

	for (curchar = 0; (c = target[curchar]) ; curchar++)
	{
		if ((c < '0' || c > '9') && c != '.')
		{
			isnamed = true;
			break;
		}
	}

	if (!isnamed)
	{
		address->sin_addr.s_addr = inet_addr (target);
		Printf ("Node number %d, address %s\n", doomcom.numnodes, target.GetChars());
	}
	else
	{
		hostentry = gethostbyname (target);
		if (!hostentry)
			I_FatalError ("gethostbyname: couldn't find %s\n%s", target.GetChars(), neterror());
		address->sin_addr.s_addr = *(int *)hostentry->h_addr_list[0];
		Printf ("Node number %d, hostname %s\n",
			doomcom.numnodes, hostentry->h_name);
	}
}